

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

string __thiscall mjs::regexp_object::to_string(regexp_object *this)

{
  wostream *pwVar1;
  gc_heap *h;
  undefined8 extraout_RDX;
  object *in_RSI;
  string sVar2;
  wstring local_1f0 [32];
  wstring_view local_1d0;
  gc_heap_ptr<mjs::gc_string> local_1c0;
  string local_1b0 [2];
  wostringstream local_190 [8];
  wostringstream woss;
  regexp_object *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  pwVar1 = std::operator<<((wostream *)local_190,"/");
  object::heap(in_RSI);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&local_1c0,(gc_heap *)&in_RSI[1].heap_);
  string::string(local_1b0,&local_1c0);
  pwVar1 = mjs::operator<<(pwVar1,local_1b0);
  pwVar1 = std::operator<<(pwVar1,"/");
  mjs::operator<<(pwVar1,in_RSI[1].properties_.pos_);
  string::~string(local_1b0);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_1c0);
  h = object::heap(in_RSI);
  std::__cxx11::wostringstream::str();
  local_1d0 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1f0);
  string::string((string *)this,h,&local_1d0);
  std::__cxx11::wstring::~wstring(local_1f0);
  std::__cxx11::wostringstream::~wostringstream(local_190);
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string() const {
        std::wostringstream woss;
        woss << "/" << source_.track(heap()) << "/" << flags_;
        return string{heap(), woss.str()};
    }